

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O1

void __thiscall PKCS7Test_CertReparseWindows_Test::TestBody(PKCS7Test_CertReparseWindows_Test *this)

{
  Span<const_unsigned_char> der;
  string local_28;
  
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs7/test/windows.p7c");
  der.size_ = local_28._M_string_length;
  der.data_ = (uchar *)local_28._M_dataplus._M_p;
  TestCertReparse(der);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS7Test, CertReparseWindows) {
  // windows.p7c is the Equifax root certificate, as exported by Windows 7.
  TestCertReparse(
      bssl::StringAsBytes(GetTestData("crypto/pkcs7/test/windows.p7c")));
}